

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::parse_go_tags
          (t_go_generator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tags,string *in)

{
  bool bVar1;
  char *pcVar2;
  mapped_type *this_00;
  string *psVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  const_iterator it;
  size_t index;
  size_t mode;
  string value;
  string key;
  string *in_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *tags_local;
  t_go_generator *this_local;
  
  std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&mode);
  index = 0;
  it._M_current = (char *)0x0;
  local_78._M_current = (char *)std::__cxx11::string::begin();
  do {
    local_80._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<(&local_78,&local_80);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&mode);
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      return;
    }
    if (((it._M_current == (char *)0x0) && (index == 0)) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in), *pcVar2 == ' ')) {
      index = 2;
    }
    if (index == 2) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in);
      if (*pcVar2 != ' ') {
        index = 0;
        goto LAB_002a56c0;
      }
    }
    else {
LAB_002a56c0:
      if (index == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in);
        if (*pcVar2 == ':') {
          index = 1;
          it._M_current = it._M_current + 1;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_78,0);
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in);
          std::__cxx11::string::operator+=((string *)(value.field_2._M_local_buf + 8),*pcVar2);
        }
      }
      else if (index == 1) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in);
        if (*pcVar2 == '\"') {
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](tags,(key_type *)((long)&value.field_2 + 8));
          std::__cxx11::string::operator=((string *)this_00,(string *)&mode);
          psVar3 = (string *)std::__cxx11::string::operator=((string *)&mode,"");
          std::__cxx11::string::operator=((string *)(value.field_2._M_local_buf + 8),psVar3);
          index = 2;
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in);
          std::__cxx11::string::operator+=((string *)&mode,*pcVar2);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_78);
    it._M_current = it._M_current + 1;
  } while( true );
}

Assistant:

void t_go_generator::parse_go_tags(map<string,string>* tags, const string in) {
  string key;
  string value;

  size_t mode=0; // 0/1/2 for key/value/whitespace
  size_t index=0;
  for (auto it=in.begin(); it<in.end(); ++it, ++index) {
      // Normally we start in key mode because the IDL is expected to be in
      // (go.tag="key:\"value\"") format, but if there is leading whitespace
      // we need to start in whitespace mode.
      if (index==0 && mode==0 && in[index]==' ') {
        mode=2;
      }

      if (mode==2) {
          if (in[index]==' ') {
              continue;
          }
          mode=0;
      }

      if (mode==0) {
          if (in[index]==':') {
              mode=1;
              index++;
              it++;
              continue;
          }
          key+=in[index];
      } else if (mode==1) {
          if (in[index]=='"') {
              (*tags)[key]=value;
              key=value="";
              mode=2;
              continue;
          }
          value+=in[index];
      }
  }
}